

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha224-256.c
# Opt level: O0

int SHA224_256ResultN(SHA256Context *context,uint8_t *Message_Digest,int HashSize)

{
  int in_EDX;
  long in_RSI;
  long in_RDI;
  int i;
  uint8_t in_stack_ffffffffffffffdf;
  int iVar1;
  undefined4 local_4;
  
  if (in_RDI == 0) {
    local_4 = 1;
  }
  else if (in_RSI == 0) {
    local_4 = 1;
  }
  else if (*(int *)(in_RDI + 0x70) == 0) {
    if (*(int *)(in_RDI + 0x6c) == 0) {
      SHA224_256Finalize((SHA256Context *)CONCAT44(in_EDX,0xaaaaaaaa),in_stack_ffffffffffffffdf);
    }
    for (iVar1 = 0; iVar1 < in_EDX; iVar1 = iVar1 + 1) {
      *(char *)(in_RSI + iVar1) =
           (char)(*(uint *)(in_RDI + (long)(iVar1 >> 2) * 4) >>
                 (('\x03' - ((byte)iVar1 & 3)) * '\b' & 0x1f));
    }
    local_4 = 0;
  }
  else {
    local_4 = *(int *)(in_RDI + 0x70);
  }
  return local_4;
}

Assistant:

static int SHA224_256ResultN(SHA256Context *context,
    uint8_t Message_Digest[ ], int HashSize)
{
  int i;

  if (!context) return shaNull;
  if (!Message_Digest) return shaNull;
  if (context->Corrupted) return context->Corrupted;

  if (!context->Computed)
    SHA224_256Finalize(context, 0x80);

  for (i = 0; i < HashSize; ++i)
    Message_Digest[i] = (uint8_t)
      (context->Intermediate_Hash[i>>2] >> 8 * ( 3 - ( i & 0x03 ) ));

  return shaSuccess;
}